

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPExternalTransmitter::SendRTPData(RTPExternalTransmitter *this,void *data,size_t len)

{
  ulong uVar1;
  size_t len_local;
  void *data_local;
  RTPExternalTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x97;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x96;
  }
  else if (this->maxpacksize < len) {
    this_local._4_4_ = -0x9a;
  }
  else if (this->sender == (RTPExternalSender *)0x0) {
    this_local._4_4_ = -0x95;
  }
  else {
    uVar1 = (**(code **)(*(long *)this->sender + 0x10))(this->sender,data,len);
    if ((uVar1 & 1) == 0) {
      this_local._4_4_ = -0x99;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPExternalTransmitter::SendRTPData(const void *data,size_t len)	
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_SPECIFIEDSIZETOOBIG;
	}
	
	if (!sender)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOSENDER;
	}

	MAINMUTEX_UNLOCK

	if (!sender->SendRTP(data, len))
		return ERR_RTP_EXTERNALTRANS_SENDERROR;

	return 0;
}